

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::clara::detail::BasicResult<Catch::clara::detail::ParseState>::enforceOk
          (BasicResult<Catch::clara::detail::ParseState> *this)

{
  Type TVar1;
  
  TVar1 = (this->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase.m_type;
  if (TVar1 == Ok) {
    return;
  }
  if (TVar1 != RuntimeError) {
    if (TVar1 == LogicError) {
      __assert_fail("m_type != ResultBase::LogicError",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/Catch2/single_include/catch2/catch.hpp"
                    ,0x233f,
                    "virtual void Catch::clara::detail::BasicResult<Catch::clara::detail::ParseState>::enforceOk() const [T = Catch::clara::detail::ParseState]"
                   );
    }
    abort();
  }
  __assert_fail("m_type != ResultBase::RuntimeError",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/Catch2/single_include/catch2/catch.hpp"
                ,0x2340,
                "virtual void Catch::clara::detail::BasicResult<Catch::clara::detail::ParseState>::enforceOk() const [T = Catch::clara::detail::ParseState]"
               );
}

Assistant:

void enforceOk() const override {

            // Errors shouldn't reach this point, but if they do
            // the actual error message will be in m_errorMessage
            assert( m_type != ResultBase::LogicError );
            assert( m_type != ResultBase::RuntimeError );
            if( m_type != ResultBase::Ok )
                std::abort();
        }